

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

gdImagePtr gdImageCreate(int sx,int sy)

{
  int *piVar1;
  int iVar2;
  gdImagePtr ptr;
  uchar **ppuVar3;
  uchar *puVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  iVar2 = overflow2(sx,sy);
  if ((((iVar2 == 0) && (iVar2 = overflow2(8,sy), iVar2 == 0)) &&
      (iVar2 = overflow2(1,sx), iVar2 == 0)) &&
     (ptr = (gdImagePtr)gdCalloc(1,0x1ca8), ptr != (gdImagePtr)0x0)) {
    ppuVar3 = (uchar **)gdMalloc((long)sy << 3);
    ptr->pixels = ppuVar3;
    if (ppuVar3 != (uchar **)0x0) {
      ptr->polyInts = (int *)0x0;
      ptr->polyAllocated = 0;
      ptr->style = (int *)0x0;
      ptr->brush = (gdImageStruct *)0x0;
      ptr->tile = (gdImageStruct *)0x0;
      if (sy < 1) {
LAB_0010adea:
        ptr->sx = sx;
        ptr->sy = sy;
        ptr->colorsTotal = 0;
        ptr->transparent = -1;
        ptr->interlace = 0;
        ptr->thick = 1;
        ptr->AA = 0;
        lVar5 = 0x305;
        do {
          piVar1 = ptr->red + lVar5 + -5;
          piVar1[0] = 1;
          piVar1[1] = 1;
          piVar1[2] = 1;
          piVar1[3] = 1;
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x405);
        ptr->trueColor = 0;
        ptr->tpixels = (int **)0x0;
        ptr->cx1 = 0;
        ptr->cy1 = 0;
        ptr->cx2 = sx + -1;
        ptr->cy2 = sy + -1;
        ptr->res_x = 0x60;
        ptr->res_y = 0x60;
        ptr->interpolation = (interpolation_method)0x0;
        ptr->interpolation_id = GD_BILINEAR_FIXED;
        return ptr;
      }
      uVar6 = 1;
LAB_0010adb6:
      puVar4 = (uchar *)gdCalloc((long)sx,1);
      ptr->pixels[uVar6 - 1] = puVar4;
      ppuVar3 = ptr->pixels;
      if (ppuVar3[uVar6 - 1] != (uchar *)0x0) goto code_r0x0010adda;
      if (uVar6 != 1) {
        do {
          gdFree(ptr->pixels[(int)uVar6 - 2]);
          uVar6 = uVar6 - 1;
        } while (1 < (long)uVar6);
        ppuVar3 = ptr->pixels;
      }
      gdFree(ppuVar3);
    }
    gdFree(ptr);
  }
  return (gdImagePtr)0x0;
code_r0x0010adda:
  bVar7 = uVar6 == (uint)sy;
  uVar6 = uVar6 + 1;
  if (bVar7) goto LAB_0010adea;
  goto LAB_0010adb6;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreate (int sx, int sy)
{
	int i;
	gdImagePtr im;

	if (overflow2(sx, sy)) {
		return NULL;
	}

	if (overflow2(sizeof (unsigned char *), sy)) {
		return NULL;
	}
	if (overflow2(sizeof (unsigned char), sx)) {
		return NULL;
	}

	im = (gdImage *) gdCalloc(1, sizeof(gdImage));
	if (!im) {
		return NULL;
	}

	/* Row-major ever since gd 1.3 */
	im->pixels = (unsigned char **) gdMalloc (sizeof (unsigned char *) * sy);
	if (!im->pixels) {
		gdFree(im);
		return NULL;
	}

	im->polyInts = 0;
	im->polyAllocated = 0;
	im->brush = 0;
	im->tile = 0;
	im->style = 0;
	for (i = 0; (i < sy); i++) {
		/* Row-major ever since gd 1.3 */
		im->pixels[i] = (unsigned char *) gdCalloc (sx, sizeof (unsigned char));
		if (!im->pixels[i]) {
			for (--i ; i >= 0; i--) {
				gdFree(im->pixels[i]);
			}
			gdFree(im->pixels);
			gdFree(im);
			return NULL;
		}

	}
	im->sx = sx;
	im->sy = sy;
	im->colorsTotal = 0;
	im->transparent = (-1);
	im->interlace = 0;
	im->thick = 1;
	im->AA = 0;
	for (i = 0; (i < gdMaxColors); i++) {
		im->open[i] = 1;
	};
	im->trueColor = 0;
	im->tpixels = 0;
	im->cx1 = 0;
	im->cy1 = 0;
	im->cx2 = im->sx - 1;
	im->cy2 = im->sy - 1;
	im->res_x = GD_RESOLUTION;
	im->res_y = GD_RESOLUTION;
	im->interpolation = NULL;
	im->interpolation_id = GD_BILINEAR_FIXED;
	return im;
}